

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

SampledSpectrum __thiscall
pbrt::UniformInfiniteLight::Le(UniformInfiniteLight *this,Ray *ray,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  array<float,_4> aVar3;
  SampledWavelengths *in_RDX;
  DenselySampledSpectrum *in_RSI;
  long in_RDI;
  undefined1 auVar6 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar9 [56];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  SampledSpectrum SVar10;
  SampledSpectrum *in_stack_ffffffffffffffb8;
  Float a;
  
  auVar9 = in_ZMM1._8_56_;
  a = *(Float *)(in_RDI + 0xc0);
  auVar6 = (undefined1  [56])0x0;
  SVar10 = DenselySampledSpectrum::Sample(in_RSI,in_RDX);
  auVar7._0_8_ = SVar10.values.values._8_8_;
  auVar7._8_56_ = auVar9;
  auVar4._0_8_ = SVar10.values.values._0_8_;
  auVar4._8_56_ = auVar6;
  auVar6 = (undefined1  [56])0x0;
  vmovlpd_avx(auVar4._0_16_);
  vmovlpd_avx(auVar7._0_16_);
  SVar10 = pbrt::operator*(a,in_stack_ffffffffffffffb8);
  auVar8._0_8_ = SVar10.values.values._8_8_;
  auVar8._8_56_ = auVar9;
  auVar5._0_8_ = SVar10.values.values._0_8_;
  auVar5._8_56_ = auVar6;
  uVar1 = vmovlpd_avx(auVar5._0_16_);
  uVar2 = vmovlpd_avx(auVar8._0_16_);
  aVar3.values[2] = (float)(int)uVar2;
  aVar3.values[3] = (float)(int)((ulong)uVar2 >> 0x20);
  aVar3.values[0] = (float)(int)uVar1;
  aVar3.values[1] = (float)(int)((ulong)uVar1 >> 0x20);
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

SampledSpectrum UniformInfiniteLight::Le(const Ray &ray,
                                         const SampledWavelengths &lambda) const {
    return scale * Lemit.Sample(lambda);
}